

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O1

void brotli::CreateBackwardReferences<brotli::HashLongestMatch<15,8,16>>
               (size_t num_bytes,size_t position,bool is_last,uint8_t *ringbuffer,
               size_t ringbuffer_mask,int quality,int lgwin,HashLongestMatch<15,_8,_16> *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  ushort uVar2;
  uint16_t uVar3;
  bool bVar4;
  size_t sVar5;
  bool bVar6;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  size_t distance_code;
  ulong uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  size_t best_len;
  Command *local_e0;
  size_t local_d8;
  uint32_t (*local_d0) [256];
  long local_c8;
  double best_score;
  size_t best_dist;
  size_t best_len_code;
  long local_a8;
  uint8_t *local_a0;
  double best_score_2;
  size_t best_dist_2;
  size_t best_len_code_2;
  ulong local_80;
  ulong local_78;
  uint8_t *local_70;
  long local_68;
  ulong local_60;
  long local_58;
  long local_50;
  Command cmd;
  
  local_d8 = ringbuffer_mask;
  if ((num_bytes < 0x201 && is_last) && position == 0) {
    if (num_bytes != 0) {
      sVar7 = 0;
      do {
        hasher->num_[(uint)(*(int *)(ringbuffer + sVar7) * 0x1e35a7bd) >> 0x11] = 0;
        hasher->need_init_ = false;
        sVar7 = sVar7 + 1;
      } while (num_bytes != sVar7);
    }
  }
  else if (hasher->need_init_ == true) {
    memset(hasher,0,0x10000);
    hasher->need_init_ = false;
  }
  if (2 < position && 2 < num_bytes) {
    uVar9 = (uint)(*(int *)(ringbuffer + (position - 3 & local_d8)) * 0x1e35a7bd) >> 0x11;
    uVar2 = hasher->num_[uVar9];
    *(int *)((long)hasher->buckets_[0] + (ulong)(uVar2 & 0xff) * 4 + (ulong)(uVar9 << 10)) =
         (int)(position - 3);
    hasher->num_[uVar9] = uVar2 + 1;
    uVar9 = (uint)(*(int *)(ringbuffer + (position - 2 & local_d8)) * 0x1e35a7bd) >> 0x11;
    uVar2 = hasher->num_[uVar9];
    *(int *)((long)hasher->buckets_[0] + (ulong)(uVar2 & 0xff) * 4 + (ulong)(uVar9 << 10)) =
         (int)(position - 2);
    hasher->num_[uVar9] = uVar2 + 1;
    uVar9 = (uint)(*(int *)(ringbuffer + (position - 1 & local_d8)) * 0x1e35a7bd) >> 0x11;
    uVar2 = hasher->num_[uVar9];
    *(int *)((long)hasher->buckets_[0] + (ulong)(uVar2 & 0xff) * 4 + (ulong)(uVar9 << 10)) =
         (int)(position - 1);
    hasher->num_[uVar9] = uVar2 + 1;
  }
  sVar7 = *last_insert_len;
  uVar15 = local_d8 & position;
  uVar1 = uVar15 + num_bytes;
  local_50 = 0x200;
  if (quality < 9) {
    local_50 = 0x40;
  }
  if (uVar15 + 3 < uVar1) {
    uVar10 = (ulong)((1 << ((byte)lgwin & 0x1f)) + -0x10);
    lVar13 = position - uVar15;
    uVar11 = local_50 + uVar15;
    local_60 = (ulong)(uint)((int)local_50 * 4);
    local_78 = uVar1 - 3;
    local_d0 = hasher->buckets_;
    local_80 = uVar1 - 4;
    local_c8 = lVar13 + 1;
    local_58 = (uVar15 - 1) + num_bytes;
    local_68 = lVar13 + 2;
    local_70 = ringbuffer + 2;
    local_e0 = commands;
    uVar16 = uVar15;
    local_a8 = lVar13;
    local_a0 = ringbuffer;
    do {
      uVar15 = uVar16 + lVar13;
      uVar12 = uVar10;
      if (uVar15 < uVar10) {
        uVar12 = uVar15;
      }
      best_len = 0;
      best_len_code = 0;
      best_dist = 0;
      best_score = 4.0;
      bVar6 = HashLongestMatch<15,_8,_16>::FindLongestMatch
                        (hasher,ringbuffer,local_d8,dist_cache,uVar15 & 0xffffffff,uVar1 - uVar16,
                         uVar12,&best_len,&best_len_code,&best_dist,&best_score);
      if (bVar6) {
        uVar15 = local_58 - uVar16;
        iVar14 = 0;
        do {
          cmd._0_8_ = best_len - 1;
          if (uVar15 < best_len - 1) {
            cmd._0_8_ = uVar15;
          }
          uVar11 = 0;
          if (4 < quality) {
            cmd._0_8_ = uVar11;
          }
          best_len_code_2 = 0;
          best_dist_2 = 0;
          best_score_2 = 4.0;
          uVar8 = local_c8 + uVar16;
          uVar12 = uVar10;
          if (uVar8 < uVar10) {
            uVar12 = uVar8;
          }
          bVar6 = HashLongestMatch<15,_8,_16>::FindLongestMatch
                            (hasher,local_a0,local_d8,dist_cache,uVar8 & 0xffffffff,uVar15,uVar12,
                             (size_t *)&cmd,&best_len_code_2,&best_dist_2,&best_score_2);
          if (bVar6) {
            if (best_score + 7.0 <= best_score_2) {
              uVar16 = uVar16 + 1;
              sVar7 = sVar7 + 1;
              best_len._0_4_ = cmd.insert_len_;
              best_len._4_4_ = cmd.copy_len_;
              best_len_code = best_len_code_2;
              best_dist = best_dist_2;
              best_score = best_score_2;
              uVar11 = (ulong)(iVar14 < 3);
              iVar14 = iVar14 + 1;
            }
            else {
              uVar11 = 0;
            }
          }
          sVar5 = best_len;
          uVar15 = uVar15 - 1;
        } while ((char)uVar11 != '\0');
        uVar15 = uVar16 + local_a8;
        if (uVar10 <= uVar16 + local_a8) {
          uVar15 = uVar10;
        }
        if (uVar15 < best_dist) goto LAB_0016d694;
        if (best_dist == (long)*dist_cache) {
          distance_code = 0;
        }
        else {
          distance_code = 1;
          if (((best_dist != (long)dist_cache[1]) &&
              (distance_code = 2, best_dist != (long)dist_cache[2])) &&
             (distance_code = 3, best_dist != (long)dist_cache[3])) {
            if (5 < best_dist && 3 < quality) {
              uVar11 = 4;
              bVar6 = false;
              do {
                if ((best_dist ==
                     (long)(int)(&kDistanceCacheOffset)[uVar11] +
                     (long)dist_cache[(uint)(&kDistanceCacheIndex)[uVar11]]) &&
                   (*(ulong *)(ComputeDistanceCode(unsigned_long,unsigned_long,int,int_const*)::
                               kLimits + uVar11 * 8) <= best_dist)) {
                  bVar4 = false;
                  distance_code = uVar11;
                }
                else {
                  bVar4 = true;
                }
                if (!bVar4) break;
                bVar6 = 0xe < uVar11;
                uVar11 = uVar11 + 1;
              } while (uVar11 != 0x10);
              if (!bVar6) goto LAB_0016d800;
            }
LAB_0016d694:
            distance_code = best_dist + 0xf;
          }
        }
LAB_0016d800:
        if (distance_code != 0 && best_dist <= uVar15) {
          dist_cache[3] = dist_cache[2];
          *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
          *dist_cache = (int)best_dist;
        }
        Command::Command(&cmd,sVar7,best_len,best_len_code,distance_code);
        local_e0->dist_extra_ = cmd.dist_extra_;
        local_e0->cmd_prefix_ = cmd.cmd_prefix_;
        local_e0->dist_prefix_ = cmd.dist_prefix_;
        local_e0->insert_len_ = cmd.insert_len_;
        local_e0->copy_len_ = cmd.copy_len_;
        local_e0->cmd_extra_ = cmd.cmd_extra_;
        *num_literals = *num_literals + sVar7;
        if (2 < best_len) {
          lVar13 = 0;
          do {
            uVar9 = (uint)(*(int *)(local_70 + lVar13 + uVar16) * 0x1e35a7bd) >> 0x11;
            uVar3 = hasher->num_[uVar9];
            *(int *)((long)*local_d0 + (ulong)(byte)uVar3 * 4 + (ulong)(uVar9 << 10)) =
                 (int)local_68 + (int)uVar16 + (int)lVar13;
            hasher->num_[uVar9] = uVar3 + 1;
            lVar13 = lVar13 + 1;
          } while (best_len - 2 != lVar13);
        }
        uVar11 = uVar16 + local_50 + sVar5 * 2;
        local_e0 = local_e0 + 1;
        uVar15 = best_len + uVar16;
        sVar7 = 0;
        lVar13 = local_a8;
        ringbuffer = local_a0;
      }
      else {
        sVar7 = sVar7 + 1;
        uVar15 = uVar16 + 1;
        if (uVar11 < uVar15) {
          if (local_60 + uVar11 < uVar15) {
            uVar12 = uVar16 + 0x11;
            if (local_80 < uVar16 + 0x11) {
              uVar12 = local_80;
            }
            if (uVar15 < uVar12) {
              iVar14 = (int)uVar16 + (int)local_c8;
              do {
                uVar9 = (uint)(*(int *)(ringbuffer + uVar15) * 0x1e35a7bd) >> 0x11;
                uVar3 = hasher->num_[uVar9];
                *(int *)((long)*local_d0 + (ulong)(byte)uVar3 * 4 + (ulong)(uVar9 << 10)) = iVar14;
                hasher->num_[uVar9] = uVar3 + 1;
                sVar7 = sVar7 + 4;
                uVar15 = uVar15 + 4;
                iVar14 = iVar14 + 4;
              } while (uVar15 < uVar12);
            }
          }
          else {
            uVar12 = uVar16 + 9;
            if (local_78 < uVar16 + 9) {
              uVar12 = local_78;
            }
            if (uVar15 < uVar12) {
              iVar14 = (int)uVar16 + (int)local_c8;
              do {
                uVar9 = (uint)(*(int *)(ringbuffer + uVar15) * 0x1e35a7bd) >> 0x11;
                uVar3 = hasher->num_[uVar9];
                *(int *)((long)*local_d0 + (ulong)(byte)uVar3 * 4 + (ulong)(uVar9 << 10)) = iVar14;
                hasher->num_[uVar9] = uVar3 + 1;
                sVar7 = sVar7 + 2;
                uVar15 = uVar15 + 2;
                iVar14 = iVar14 + 2;
              } while (uVar15 < uVar12);
            }
          }
        }
      }
      uVar16 = uVar15;
    } while (uVar15 + 3 < uVar1);
  }
  else {
    local_e0 = commands;
  }
  *last_insert_len = (uVar1 - uVar15) + sVar7;
  *num_commands = *num_commands + ((long)local_e0 - (long)commands >> 3) * -0x5555555555555555;
  return;
}

Assistant:

void CreateBackwardReferences(size_t num_bytes,
                              size_t position,
                              bool is_last,
                              const uint8_t* ringbuffer,
                              size_t ringbuffer_mask,
                              const int quality,
                              const int lgwin,
                              Hasher* hasher,
                              int* dist_cache,
                              size_t* last_insert_len,
                              Command* commands,
                              size_t* num_commands,
                              size_t* num_literals) {
  // Set maximum distance, see section 9.1. of the spec.
  const size_t max_backward_limit = (1 << lgwin) - 16;

  // Choose which init method is faster.
  // memset is about 100 times faster than hasher->InitForData().
  const size_t kMaxBytesForPartialHashInit = Hasher::kHashMapSize >> 7;
  if (position == 0 && is_last && num_bytes <= kMaxBytesForPartialHashInit) {
    hasher->InitForData(ringbuffer, num_bytes);
  } else {
    hasher->Init();
  }
  if (num_bytes >= 3 && position >= 3) {
    // Prepare the hashes for three last bytes of the last write.
    // These could not be calculated before, since they require knowledge
    // of both the previous and the current block.
    hasher->Store(&ringbuffer[(position - 3) & ringbuffer_mask],
                  static_cast<uint32_t>(position - 3));
    hasher->Store(&ringbuffer[(position - 2) & ringbuffer_mask],
                  static_cast<uint32_t>(position - 2));
    hasher->Store(&ringbuffer[(position - 1) & ringbuffer_mask],
                  static_cast<uint32_t>(position - 1));
  }
  const Command * const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  size_t i = position & ringbuffer_mask;
  const size_t i_diff = position - i;
  const size_t i_end = i + num_bytes;

  // For speed up heuristics for random data.
  const size_t random_heuristics_window_size = quality < 9 ? 64 : 512;
  size_t apply_random_heuristics = i + random_heuristics_window_size;

  // Minimum score to accept a backward reference.
  const int kMinScore = 4.0;

  while (i + Hasher::kHashTypeLength - 1 < i_end) {
    size_t max_length = i_end - i;
    size_t max_distance = std::min(i + i_diff, max_backward_limit);
    size_t best_len = 0;
    size_t best_len_code = 0;
    size_t best_dist = 0;
    double best_score = kMinScore;
    bool match_found = hasher->FindLongestMatch(
        ringbuffer, ringbuffer_mask,
        dist_cache, static_cast<uint32_t>(i + i_diff), max_length, max_distance,
        &best_len, &best_len_code, &best_dist, &best_score);
    if (match_found) {
      // Found a match. Let's look for something even better ahead.
      int delayed_backward_references_in_row = 0;
      for (;;) {
        --max_length;
        size_t best_len_2 =
            quality < 5 ? std::min(best_len - 1, max_length) : 0;
        size_t best_len_code_2 = 0;
        size_t best_dist_2 = 0;
        double best_score_2 = kMinScore;
        max_distance = std::min(i + i_diff + 1, max_backward_limit);
        match_found = hasher->FindLongestMatch(
            ringbuffer, ringbuffer_mask,
            dist_cache, static_cast<uint32_t>(i + i_diff + 1),
            max_length, max_distance,
            &best_len_2, &best_len_code_2, &best_dist_2, &best_score_2);
        double cost_diff_lazy = 7.0;
        if (match_found && best_score_2 >= best_score + cost_diff_lazy) {
          // Ok, let's just write one byte for now and start a match from the
            // next byte.
          ++i;
          ++insert_length;
          best_len = best_len_2;
          best_len_code = best_len_code_2;
          best_dist = best_dist_2;
          best_score = best_score_2;
          if (++delayed_backward_references_in_row < 4) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          i + 2 * best_len + random_heuristics_window_size;
      max_distance = std::min(i + i_diff, max_backward_limit);
      // The first 16 codes are special shortcodes, and the minimum offset is 1.
      size_t distance_code =
          ComputeDistanceCode(best_dist, max_distance, quality, dist_cache);
      if (best_dist <= max_distance && distance_code > 0) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = dist_cache[0];
        dist_cache[0] = static_cast<int>(best_dist);
      }
      Command cmd(insert_length, best_len, best_len_code, distance_code);
      *commands++ = cmd;
      *num_literals += insert_length;
      insert_length = 0;
      // Put the hash keys into the table, if there are enough
      // bytes left.
      for (size_t j = 2; j < best_len; ++j) {
        hasher->Store(&ringbuffer[i + j],
                      static_cast<uint32_t>(i + i_diff + j));
      }
      i += best_len;
    } else {
      ++insert_length;
      ++i;
      // If we have not seen matches for a long time, we can skip some
      // match lookups. Unsuccessful match lookups are very very expensive
      // and this kind of a heuristic speeds up compression quite
      // a lot.
      if (i > apply_random_heuristics) {
        // Going through uncompressible data, jump.
        if (i > apply_random_heuristics + 4 * random_heuristics_window_size) {
          // It is quite a long time since we saw a copy, so we assume
          // that this data is not compressible, and store hashes less
          // often. Hashes of non compressible data are less likely to
          // turn out to be useful in the future, too, so we store less of
          // them to not to flood out the hash table of good compressible
          // data.
          size_t i_jump = std::min(i + 16, i_end - 4);
          for (; i < i_jump; i += 4) {
            hasher->Store(ringbuffer + i, static_cast<uint32_t>(i + i_diff));
            insert_length += 4;
          }
        } else {
          size_t i_jump = std::min(i + 8, i_end - 3);
          for (; i < i_jump; i += 2) {
            hasher->Store(ringbuffer + i, static_cast<uint32_t>(i + i_diff));
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += i_end - i;
  *last_insert_len = insert_length;
  *num_commands += static_cast<size_t>(commands - orig_commands);
}